

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

UInt __thiscall Json::Value::asUInt(Value *this)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  runtime_error *this_00;
  
  uVar3 = (uint)(byte)this->field_0x8;
  switch(this->field_0x8) {
  case 0:
    break;
  case 1:
    bVar2 = isUInt(this);
    if (!bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"LargestInt out of UInt range");
      goto LAB_00471356;
    }
    goto LAB_004712d7;
  case 2:
    bVar2 = isUInt(this);
    if (!bVar2) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"LargestUInt out of UInt range");
      goto LAB_00471356;
    }
LAB_004712d7:
    uVar3 = *(uint *)&this->value_;
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((dVar1 < 0.0) || (4294967295.0 < dVar1)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"double out of UInt range");
      goto LAB_00471356;
    }
    uVar3 = (uint)(long)dVar1;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Value is not convertible to UInt.");
LAB_00471356:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    uVar3 = (uint)(this->value_).bool_;
  }
  return uVar3;
}

Assistant:

Value::UInt Value::asUInt() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestInt out of UInt range");
    return UInt(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isUInt(), "LargestUInt out of UInt range");
    return UInt(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, 0, maxUInt),
                        "double out of UInt range");
    return UInt(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to UInt.");
}